

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandLexicalScope
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  function<bool_(CommonDebugInfoInstructions)> expectation;
  undefined1 local_248 [48];
  size_t local_218;
  __buckets_ptr local_210 [2];
  DiagnosticStream local_200;
  
  local_248._0_8_ = (spv_const_context)0x0;
  local_248._8_8_ = (spv_const_validator_options)0x0;
  local_248._24_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:231:7)>
       ::_M_invoke;
  local_248._16_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:231:7)>
       ::_M_manager;
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    ((anon_unknown_0 *)_,(ValidationState_t *)local_248,
                     (function<bool_(CommonDebugInfoInstructions)> *)
                     (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (Instruction *)
                     (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,word_index);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*ext_inst_name->_M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_248 + 0x28),(_Any_data *)ext_inst_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,(char *)local_248._40_8_,local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"expected operand ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,(debug_inst_name->_M_dataplus)._M_p,
               debug_inst_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200," must be a result id of a lexical scope",0x27);
    if ((undefined1 *)local_248._40_8_ != local_248 + 0x38) {
      operator_delete((void *)local_248._40_8_,(long)local_210[0] + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_200);
    sVar2 = local_200.error_;
  }
  if ((code *)local_248._16_8_ != (code *)0x0) {
    (*(code *)local_248._16_8_)(local_248,local_248,3);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateOperandLexicalScope(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == CommonDebugInfoDebugCompilationUnit ||
               dbg_inst == CommonDebugInfoDebugFunction ||
               dbg_inst == CommonDebugInfoDebugLexicalBlock ||
               dbg_inst == CommonDebugInfoDebugTypeComposite;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " must be a result id of a lexical scope";
}